

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_dispatch.cpp
# Opt level: O3

void C_DoCommand(char *cmd,int keynum)

{
  char cVar1;
  FButtonStatus *this;
  char *pcVar2;
  int iVar3;
  DWORD DVar4;
  FConsoleCommand *command;
  FBaseCVar *this_00;
  char *pcVar5;
  undefined4 extraout_var;
  DStoredCommand *this_01;
  int min;
  size_t __n;
  char *pcVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  char *pcVar10;
  ulong __n_00;
  bool bVar11;
  FConsoleCommand *dummy;
  FCommandLine local_58;
  
  do {
    pcVar5 = cmd;
    cVar1 = *pcVar5;
    cmd = pcVar5 + 1;
    if (cVar1 == '\0') break;
  } while (cVar1 < '!');
  pcVar6 = cmd;
  pcVar10 = pcVar5;
  if (cVar1 == '\"') {
    for (; (pcVar5 = cmd, *pcVar6 != '\0' && (*pcVar6 != '\"')); pcVar6 = pcVar6 + 1) {
    }
  }
  else {
    do {
      pcVar2 = pcVar10 + 1;
      pcVar6 = pcVar10 + 1;
      pcVar10 = pcVar6;
    } while (' ' < *pcVar2);
  }
  __n_00 = (long)pcVar6 - (long)pcVar5;
  if (ParsingKeyConf) {
    lVar9 = 8;
    while( true ) {
      pcVar6 = KeyConfCommands[lVar9];
      iVar3 = strncasecmp(pcVar5,pcVar6,__n_00);
      if ((iVar3 == 0) && (pcVar6[__n_00] == '\0')) break;
      bVar11 = lVar9 == 0;
      lVar9 = lVar9 + -1;
      if (bVar11) {
        Printf("Invalid command for KEYCONF: %s\n",pcVar5);
        return;
      }
    }
  }
  cVar1 = *pcVar5;
  if ((cVar1 == '-') || (cVar1 == '+')) {
    DVar4 = SuperFastHashI(pcVar5 + 1,__n_00 - 1);
    iVar3 = 0;
    iVar8 = 0x1f;
    do {
      uVar7 = (uint)(iVar3 + iVar8) >> 1;
      if (ActionMaps[uVar7].Key == DVar4) {
        this = ActionMaps[uVar7].Button;
        if (this != (FButtonStatus *)0x0) {
          if (cVar1 == '+') {
            FButtonStatus::PressKey(this,keynum);
            return;
          }
          FButtonStatus::ReleaseKey(this,keynum);
          if (this != &Button_Mlook) {
            return;
          }
          if (lookspring.Value != true) {
            return;
          }
          Net_WriteByte('$');
          return;
        }
        break;
      }
      if (ActionMaps[uVar7].Key < DVar4) {
        iVar3 = uVar7 + 1;
      }
      else {
        iVar8 = uVar7 - 1;
      }
    } while (iVar3 <= iVar8);
  }
  DVar4 = SuperFastHashI(pcVar5,__n_00);
  command = ScanChainForName(Commands[DVar4 % 0xfb],pcVar5,__n_00,(FConsoleCommand **)&local_58);
  local_58.cmd = pcVar5;
  if (command == (FConsoleCommand *)0x0) {
    this_00 = FindCVarSub(pcVar5,(int)__n_00);
    if (this_00 == (FBaseCVar *)0x0) {
      Printf("Unknown command \"%.*s\"\n",__n_00 & 0xffffffff,pcVar5);
      return;
    }
    local_58._argc = -1;
    local_58._argv = (char **)0x0;
    local_58.noescapes = false;
    iVar3 = FCommandLine::argc(&local_58);
    if (iVar3 < 2) {
      pcVar5 = this_00->Name;
      iVar3 = (*this_00->_vptr_FBaseCVar[3])(this_00,0xffffffff);
      Printf("\"%s\" is \"%s\"\n",pcVar5,CONCAT44(extraout_var,iVar3));
    }
    else {
      pcVar5 = FCommandLine::operator[](&local_58,1);
      FBaseCVar::CmdSet(this_00,pcVar5);
    }
    goto LAB_0035a8a7;
  }
  if ((gamestate != GS_STARTUP) || (ParsingKeyConf != false)) goto LAB_0035a867;
  switch(__n_00) {
  case 3:
    pcVar6 = "set";
    __n = 3;
    break;
  case 4:
    iVar3 = strncasecmp(pcVar5,"bind",4);
    if ((iVar3 == 0) || (iVar3 = strncasecmp(pcVar5,"exec",4), iVar3 == 0)) goto LAB_0035a867;
    iVar3 = strncasecmp(pcVar5,"warp",4);
    if (iVar3 == 0) {
      FString::operator=(&StoredWarp,pcVar5);
      return;
    }
  default:
    goto switchD_0035a697_caseD_5;
  case 6:
    pcVar6 = "pullin";
    __n = 6;
    break;
  case 7:
    pcVar6 = "logfile";
    __n = 7;
    break;
  case 9:
    pcVar6 = "unbindall";
    __n = 9;
    break;
  case 10:
    pcVar6 = "doublebind";
    __n = 10;
  }
  iVar3 = strncasecmp(pcVar5,pcVar6,__n);
  if (iVar3 == 0) {
LAB_0035a867:
    local_58._argc = -1;
    local_58._argv = (char **)0x0;
    local_58.noescapes = false;
    (*command->_vptr_FConsoleCommand[3])
              (command,&local_58,(&players)[(long)consoleplayer * 0x54],keynum);
LAB_0035a8a7:
    if (local_58._argv != (char **)0x0) {
      operator_delete__(local_58._argv);
    }
  }
  else {
switchD_0035a697_caseD_5:
    this_01 = (DStoredCommand *)
              M_Malloc_Dbg(0x48,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                           ,0x1f9);
    DStoredCommand::DStoredCommand(this_01,command,pcVar5);
  }
  return;
}

Assistant:

void C_DoCommand (const char *cmd, int keynum)
{
	FConsoleCommand *com;
	const char *end;
	const char *beg;

	// Skip any beginning whitespace
	while (*cmd && *cmd <= ' ')
		cmd++;

	// Find end of the command name
	if (*cmd == '\"')
	{
		for (end = beg = cmd+1; *end && *end != '\"'; ++end)
			;
	}
	else
	{
		beg = cmd;
		for (end = cmd+1; *end > ' '; ++end)
			;
	}

	const size_t len = end - beg;

	if (ParsingKeyConf)
	{
		int i;

		for (i = countof(KeyConfCommands)-1; i >= 0; --i)
		{
			if (strnicmp (beg, KeyConfCommands[i], len) == 0 &&
				KeyConfCommands[i][len] == 0)
			{
				break;
			}
		}
		if (i < 0)
		{
			Printf ("Invalid command for KEYCONF: %s\n", beg);
			return;
		}
	}

	// Check if this is an action
	if (*beg == '+' || *beg == '-')
	{
		FButtonStatus *button;

		button = FindButton (MakeKey (beg + 1, end - beg - 1));
		if (button != NULL)
		{
			if (*beg == '+')
			{
				button->PressKey (keynum);
			}
			else
			{
				button->ReleaseKey (keynum);
				if (button == &Button_Mlook && lookspring)
				{
					Net_WriteByte (DEM_CENTERVIEW);
				}
			}
			return;
		}
	}
	
	// Parse it as a normal command
	// Checking for matching commands follows this search order:
	//	1. Check the Commands[] hash table
	//	2. Check the CVars list

	if ( (com = FindNameInHashTable (Commands, beg, len)) )
	{
		if (gamestate != GS_STARTUP || ParsingKeyConf ||
			(len == 3 && strnicmp (beg, "set", 3) == 0) ||
			(len == 7 && strnicmp (beg, "logfile", 7) == 0) ||
			(len == 9 && strnicmp (beg, "unbindall", 9) == 0) ||
			(len == 4 && strnicmp (beg, "bind", 4) == 0) ||
			(len == 4 && strnicmp (beg, "exec", 4) == 0) ||
			(len ==10 && strnicmp (beg, "doublebind", 10) == 0) ||
			(len == 6 && strnicmp (beg, "pullin", 6) == 0)
			)
		{
			FCommandLine args (beg);
			com->Run (args, players[consoleplayer].mo, keynum);
		}
		else
		{
			if (len == 4 && strnicmp(beg, "warp", 4) == 0)
			{
				StoredWarp = beg;
			}
			else
			{
				new DStoredCommand (com, beg);
			}
		}
	}
	else
	{ // Check for any console vars that match the command
		FBaseCVar *var = FindCVarSub (beg, int(len));

		if (var != NULL)
		{
			FCommandLine args (beg);

			if (args.argc() >= 2)
			{ // Set the variable
				var->CmdSet (args[1]);
			}
			else
			{ // Get the variable's value
				Printf ("\"%s\" is \"%s\"\n", var->GetName(), var->GetHumanString());
			}
		}
		else
		{ // We don't know how to handle this command
			Printf ("Unknown command \"%.*s\"\n", (int)len, beg);
		}
	}
}